

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.hpp
# Opt level: O0

string * __thiscall CLI::Timer::to_string_abi_cxx11_(string *__return_storage_ptr__,Timer *this)

{
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  Timer *local_18;
  Timer *this_local;
  
  local_18 = this;
  this_local = (Timer *)__return_storage_ptr__;
  ::std::__cxx11::string::string((string *)&local_38,(string *)this);
  make_time_str_abi_cxx11_(&local_58,this);
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::operator()(__return_storage_ptr__,&this->time_print_,&local_38,&local_58);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string() const { return time_print_(title_, make_time_str()); }